

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void * __thiscall
pugi::impl::anon_unknown_0::xml_allocator::allocate_memory
          (xml_allocator *this,size_t size,xml_memory_page **out_page)

{
  void *pvVar1;
  long *in_RDX;
  xml_memory_page **in_RSI;
  long *in_RDI;
  void *buf;
  xml_allocator *in_stack_fffffffffffffff8;
  
  if ((ulong)(in_RDI[1] + (long)in_RSI) < 0x7fd9) {
    pvVar1 = (void *)(*in_RDI + 0x28 + in_RDI[1]);
    in_RDI[1] = (long)in_RSI + in_RDI[1];
    *in_RDX = *in_RDI;
  }
  else {
    pvVar1 = allocate_memory_oob(in_stack_fffffffffffffff8,(size_t)in_RDI,in_RSI);
  }
  return pvVar1;
}

Assistant:

void* allocate_memory(size_t size, xml_memory_page*& out_page)
		{
			if (PUGI_IMPL_UNLIKELY(_busy_size + size > xml_memory_page_size))
				return allocate_memory_oob(size, out_page);

			void* buf = reinterpret_cast<char*>(_root) + sizeof(xml_memory_page) + _busy_size;

			_busy_size += size;

			out_page = _root;

			return buf;
		}